

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O2

DWORD * __thiscall
MIDISong2::SendCommand
          (MIDISong2 *this,DWORD *events,TrackInfo *track,DWORD delay,ptrdiff_t room,
          bool *sysex_noroom)

{
  BYTE BVar1;
  char cVar2;
  BYTE *pBVar3;
  TrackInfo *pTVar4;
  byte bVar5;
  DWORD DVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  byte bVar15;
  undefined1 uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  DWORD *__dest;
  undefined1 *puVar20;
  undefined1 *puVar21;
  
  *sysex_noroom = false;
  uVar14 = track->TrackP;
  uVar12 = track->MaxTrackP;
  if (uVar12 <= uVar14) goto LAB_0037e722;
  pBVar3 = track->TrackBegin;
  uVar9 = uVar14 + 1;
  track->TrackP = uVar9;
  if (uVar12 <= uVar9) goto LAB_0037e722;
  bVar15 = pBVar3[uVar14];
  uVar19 = (uint)bVar15;
  *events = delay;
  events[1] = 0;
  events[2] = 0x2000000;
  uVar11 = (uint)bVar15;
  if ((uVar11 - 0xf0 < 0x10) && ((0x8081U >> (uVar11 - 0xf0 & 0x1f) & 1) != 0)) {
    if (uVar11 != 0xf0) {
      if (uVar11 == 0xff) {
        track->TrackP = uVar14 + 2;
        if (uVar12 <= uVar14 + 2) goto LAB_0037e722;
        BVar1 = pBVar3[uVar14 + 1];
        DVar6 = TrackInfo::ReadVarLen(track);
        uVar14 = track->TrackP;
        uVar12 = track->MaxTrackP;
        if (uVar12 <= uVar14) {
          track->Finished = true;
          return events;
        }
        uVar9 = DVar6 + uVar14;
        if (uVar9 <= uVar12) {
          if (BVar1 == 'Q') {
            pBVar3 = track->TrackBegin;
            (this->super_MIDIStreamer).Tempo =
                 (uint)pBVar3[uVar14 + 2] |
                 (uint)pBVar3[uVar14 + 1] << 8 | (uint)pBVar3[uVar14] << 0x10;
            *events = delay;
            events[1] = 0;
            events[2] = (this->super_MIDIStreamer).Tempo | 0x1000000;
          }
          else if (BVar1 == '/') {
            track->Finished = true;
          }
          track->TrackP = uVar9;
          if (uVar9 != uVar12) goto LAB_0037e61e;
        }
LAB_0037e7e8:
        track->Finished = true;
        goto LAB_0037e61e;
      }
      if (uVar11 != 0xf7) goto LAB_0037e61e;
    }
    DVar6 = TrackInfo::ReadVarLen(track);
    if (DVar6 < 0x5f4) {
      if ((ulong)(room << 2) <= (ulong)(DVar6 + 0xc)) {
        track->TrackP = uVar14;
        *sysex_noroom = true;
        return events;
      }
      if (bVar15 == 0xf0) {
        uVar11 = DVar6 + 0x80000001;
        __dest = (DWORD *)((long)events + 0xd);
        *(undefined1 *)(events + 3) = 0xf0;
      }
      else {
        __dest = events + 3;
        uVar11 = DVar6 | 0x80000000;
      }
      events[2] = uVar11;
      uVar14 = (ulong)DVar6;
      memcpy(__dest,track->TrackBegin + track->TrackP,uVar14);
      puVar20 = (undefined1 *)((long)__dest + uVar14);
      for (puVar21 = puVar20; ((ulong)puVar21 & 3) != 0; puVar21 = puVar21 + 1) {
        *puVar20 = 0;
        puVar20 = puVar20 + 1;
      }
      track->TrackP = track->TrackP + uVar14;
    }
    else {
      track->TrackP = track->TrackP + (ulong)DVar6;
    }
    goto LAB_0037e61e;
  }
  if ((~uVar11 & 0xf0) == 0) {
    if (MIDI_CommonLengths[uVar11 & 0xf] < '\x01') {
      uVar19 = 0;
      uVar11 = 0;
    }
    else {
      track->TrackP = uVar14 + 2;
      uVar19 = (uint)pBVar3[uVar14 + 1];
      if (MIDI_CommonLengths[uVar11 & 0xf] < '\x02') goto LAB_0037e693;
      uVar9 = uVar14 + 3;
      track->TrackP = uVar9;
      uVar11 = (uint)pBVar3[uVar14 + 2];
    }
  }
  else if ((char)bVar15 < '\0') {
    track->RunningStatus = bVar15;
    track->TrackP = uVar14 + 2;
    uVar19 = (uint)pBVar3[uVar14 + 1];
LAB_0037e693:
    uVar9 = uVar14 + 2;
    uVar11 = 0;
  }
  else {
    bVar15 = track->RunningStatus;
    uVar11 = 0;
  }
  if (uVar12 <= uVar9) {
LAB_0037e722:
    track->Finished = true;
    return events;
  }
  uVar18 = (uint)bVar15;
  uVar17 = uVar18 & 0x70;
  if (MIDI_EventLengths[uVar17 >> 4] == '\x02') {
    track->TrackP = uVar9 + 1;
    uVar11 = (uint)pBVar3[uVar9];
  }
  if (uVar17 != 0x30) {
    if (uVar17 == 0x40) {
      cVar2 = track->EProgramChange;
joined_r0x0037e6db:
      if (cVar2 != '\0') goto LAB_0037e61e;
    }
    goto switchD_0037e752_caseD_72;
  }
  bVar5 = (byte)uVar11;
  switch(uVar19) {
  case 0x6e:
    uVar19 = 0x6e;
    if (track->PlayedTime < (uint)(this->super_MIDIStreamer).Division) {
      if (bVar5 == 0x7f) {
        track->Designation = 0xffff;
      }
      else {
        if (9 < bVar5) goto LAB_0037e61e;
        track->Designation = track->Designation | (ushort)(1 << (bVar5 & 0x1f));
      }
      track->Designated = true;
      goto LAB_0037e61e;
    }
    break;
  case 0x6f:
    uVar19 = 0x6f;
    if (track->PlayedTime < (uint)(this->super_MIDIStreamer).Division) {
      if ((track->Designated == true) && (bVar5 < 10)) {
        track->Designation =
             track->Designation &
             ((ushort)(-2 << (bVar5 & 0x1f)) | (ushort)(0xfffffffe >> 0x20 - (bVar5 & 0x1f)));
      }
      goto LAB_0037e61e;
    }
    break;
  case 0x70:
    if (((uint)(this->super_MIDIStreamer).Division <= track->PlayedTime) &&
       (uVar19 = 0x70, track->EProgramChange != true)) break;
    track->EProgramChange = true;
    uVar18 = (uint)(bVar15 & 0xf | 0xc0);
    uVar17 = 0;
    uVar19 = uVar11;
    goto LAB_0037e6ef;
  case 0x71:
    if ((track->PlayedTime < (uint)(this->super_MIDIStreamer).Division) ||
       (uVar19 = 0x71, track->EVolume == true)) {
      track->EVolume = true;
LAB_0037e9cc:
      uVar11 = MIDIStreamer::VolumeControllerChange(&this->super_MIDIStreamer,bVar15 & 0xf,uVar11);
      uVar19 = 7;
    }
    break;
  case 0x72:
  case 0x73:
    break;
  case 0x74:
    iVar7 = uVar11 + 1;
    if (bVar5 == 0) {
      iVar7 = 0;
    }
    iVar7 = MIDIStreamer::ClampLoopCount(&this->super_MIDIStreamer,iVar7);
    if (iVar7 != 1) {
      track->LoopBegin = track->TrackP;
      track->LoopDelay = 0;
      iVar8 = iVar7 + -1;
      if (iVar7 == 0) {
        iVar8 = 0;
      }
      track->LoopCount = iVar8;
      track->LoopFinished = track->Finished;
    }
    goto LAB_0037e61e;
  case 0x75:
    iVar7 = track->LoopCount;
    if ((iVar7 < 0) || (bVar5 != 0x7f)) goto LAB_0037e61e;
    if (iVar7 == 0) {
      if ((this->super_MIDIStreamer).super_MusInfo.m_Looping == false) goto LAB_0037e7e8;
    }
    else {
      track->LoopCount = -(uint)(iVar7 - 1U == 0) | iVar7 - 1U;
    }
    track->TrackP = track->LoopBegin;
    track->Delay = track->LoopDelay;
    track->Finished = track->LoopFinished;
    goto LAB_0037e61e;
  case 0x76:
    uVar14 = 0;
    iVar7 = uVar11 + 1;
    if (bVar5 == 0) {
      iVar7 = 0;
    }
    iVar7 = MIDIStreamer::ClampLoopCount(&this->super_MIDIStreamer,iVar7);
    if (iVar7 + -1 != 0) {
      pTVar4 = this->Tracks;
      iVar8 = iVar7 + -1;
      if (iVar7 == 0) {
        iVar8 = 0;
      }
      uVar12 = (ulong)(uint)this->NumTracks;
      if (this->NumTracks < 1) {
        uVar12 = uVar14;
      }
      for (; uVar12 * 0x40 != uVar14; uVar14 = uVar14 + 0x40) {
        *(undefined8 *)((long)&pTVar4->LoopBegin + uVar14) =
             *(undefined8 *)((long)&pTVar4->TrackP + uVar14);
        *(undefined4 *)((long)&pTVar4->LoopDelay + uVar14) =
             *(undefined4 *)((long)&pTVar4->Delay + uVar14);
        *(int *)((long)&pTVar4->LoopCount + uVar14) = iVar8;
        (&pTVar4->LoopFinished)[uVar14] = (&pTVar4->Finished)[uVar14];
      }
    }
    goto LAB_0037e61e;
  case 0x77:
    if (bVar5 == 0x7f) {
      lVar10 = 0x38;
      for (lVar13 = 0; lVar13 < this->NumTracks; lVar13 = lVar13 + 1) {
        pTVar4 = this->Tracks;
        iVar7 = *(int *)((long)pTVar4 + lVar10 + -4);
        if (-1 < iVar7) {
          if (iVar7 == 0) {
            uVar16 = 1;
            if ((this->super_MIDIStreamer).super_MusInfo.m_Looping != false) goto LAB_0037e8df;
          }
          else {
            *(uint *)((long)pTVar4 + lVar10 + -4) = -(uint)(iVar7 - 1U == 0) | iVar7 - 1U;
LAB_0037e8df:
            *(undefined8 *)((long)pTVar4 + lVar10 + -0x30) =
                 *(undefined8 *)((long)pTVar4 + lVar10 + -0x10);
            *(undefined4 *)((long)pTVar4 + lVar10 + -0x20) =
                 *(undefined4 *)((long)pTVar4 + lVar10 + -8);
            uVar16 = *(undefined1 *)((long)&pTVar4->TrackBegin + lVar10);
          }
          *(undefined1 *)((long)pTVar4 + lVar10 + -0x18) = uVar16;
        }
        lVar10 = lVar10 + 0x40;
      }
    }
    goto LAB_0037e61e;
  default:
    if (uVar19 == 0x27) {
      uVar19 = 0x27;
      cVar2 = track->EVolume;
      goto joined_r0x0037e6db;
    }
    if (uVar19 == 7) {
      if (track->EVolume != false) goto LAB_0037e61e;
      goto LAB_0037e9cc;
    }
  }
switchD_0037e752_caseD_72:
  uVar17 = uVar11;
  if (bVar15 != 0xff) {
LAB_0037e6ef:
    if ((track->Designated != true) || ((track->Designation & this->DesignationMask) != 0)) {
      events[2] = (uVar17 & 0xff) << 0x10 | uVar19 << 8 | uVar18;
    }
  }
LAB_0037e61e:
  if (track->Finished == false) {
    DVar6 = TrackInfo::ReadVarLen(track);
    track->Delay = DVar6;
  }
  if ((events[2] & 0xff000000) != 0x2000000 || *events != 0) {
    events = events + 3;
  }
  return events;
}

Assistant:

DWORD *MIDISong2::SendCommand (DWORD *events, TrackInfo *track, DWORD delay, ptrdiff_t room, bool &sysex_noroom)
{
	DWORD len;
	BYTE event, data1 = 0, data2 = 0;
	int i;

	sysex_noroom = false;
	size_t start_p = track->TrackP;

	CHECK_FINISHED
	event = track->TrackBegin[track->TrackP++];
	CHECK_FINISHED

	// The actual event type will be filled in below.
	events[0] = delay;
	events[1] = 0;
	events[2] = MEVT_NOP << 24;

	if (event != MIDI_SYSEX && event != MIDI_META && event != MIDI_SYSEXEND)
	{
		// Normal short message
		if ((event & 0xF0) == 0xF0)
		{
			if (MIDI_CommonLengths[event & 15] > 0)
			{
				data1 = track->TrackBegin[track->TrackP++];
				if (MIDI_CommonLengths[event & 15] > 1)
				{
					data2 = track->TrackBegin[track->TrackP++];
				}
			}
		}
		else if ((event & 0x80) == 0)
		{
			data1 = event;
			event = track->RunningStatus;
		}
		else
		{
			track->RunningStatus = event;
			data1 = track->TrackBegin[track->TrackP++];
		}

		CHECK_FINISHED

		if (MIDI_EventLengths[(event&0x70)>>4] == 2)
		{
			data2 = track->TrackBegin[track->TrackP++];
		}

		switch (event & 0x70)
		{
		case MIDI_PRGMCHANGE & 0x70:
			if (track->EProgramChange)
			{
				event = MIDI_META;
			}
			break;

		case MIDI_CTRLCHANGE & 0x70:
			switch (data1)
			{
			case 7:		// Channel volume
				if (track->EVolume)
				{ // Tracks that use EMIDI volume ignore normal volume changes.
					event = MIDI_META;
				}
				else
				{
					data2 = VolumeControllerChange(event & 15, data2);
				}
				break;

			case 7+32:	// Channel volume (LSB)
				if (track->EVolume)
				{
					event = MIDI_META;
				}
				// It should be safe to pass this straight through to the
				// MIDI device, since it's a very fine amount.
				break;

			case 110:	// EMIDI Track Designation - InitBeat only
				// Instruments 4, 5, 6, and 7 are all FM synth.
				// The rest are all wavetable.
				if (track->PlayedTime < (DWORD)Division)
				{
					if (data2 == 127)
					{
						track->Designation = ~0;
						track->Designated = true;
					}
					else if (data2 <= 9)
					{
						track->Designation |= 1 << data2;
						track->Designated = true;
					}
					event = MIDI_META;
				}
				break;

			case 111:	// EMIDI Track Exclusion - InitBeat only
				if (track->PlayedTime < (DWORD)Division)
				{
					if (track->Designated && data2 <= 9)
					{
						track->Designation &= ~(1 << data2);
					}
					event = MIDI_META;
				}
				break;

			case 112:	// EMIDI Program Change
				// Ignored unless it also appears in the InitBeat
				if (track->PlayedTime < (DWORD)Division || track->EProgramChange)
				{
					track->EProgramChange = true;
					event = 0xC0 | (event & 0x0F);
					data1 = data2;
					data2 = 0;
				}
				break;

			case 113:	// EMIDI Volume
				// Ignored unless it also appears in the InitBeat
				if (track->PlayedTime < (DWORD)Division || track->EVolume)
				{
					track->EVolume = true;
					data1 = 7;
					data2 = VolumeControllerChange(event & 15, data2);
				}
				break;

			case 116:	// EMIDI Loop Begin
				{
					// We convert the loop count to XMIDI conventions before clamping.
					// Then we convert it back to EMIDI conventions after clamping.
					// (XMIDI can create "loops" that don't loop. EMIDI cannot.)
					int loopcount = ClampLoopCount(data2 == 0 ? 0 : data2 + 1);
					if (loopcount != 1)
					{
						track->LoopBegin = track->TrackP;
						track->LoopDelay = 0;
						track->LoopCount = loopcount == 0 ? 0 : loopcount - 1;
						track->LoopFinished = track->Finished;
					}
				}
				event = MIDI_META;
				break;

			case 117:	// EMIDI Loop End
				if (track->LoopCount >= 0 && data2 == 127)
				{
					if (track->LoopCount == 0 && !m_Looping)
					{
						track->Finished = true;
					}
					else
					{
						if (track->LoopCount > 0 && --track->LoopCount == 0)
						{
							track->LoopCount = -1;
						}
						track->TrackP = track->LoopBegin;
						track->Delay = track->LoopDelay;
						track->Finished = track->LoopFinished;
					}
				}
				event = MIDI_META;
				break;

			case 118:	// EMIDI Global Loop Begin
				{
					int loopcount = ClampLoopCount(data2 == 0 ? 0 : data2 + 1);
					if (loopcount != 1)
					{
						for (i = 0; i < NumTracks; ++i)
						{
							Tracks[i].LoopBegin = Tracks[i].TrackP;
							Tracks[i].LoopDelay = Tracks[i].Delay;
							Tracks[i].LoopCount = loopcount == 0 ? 0 : loopcount - 1;
							Tracks[i].LoopFinished = Tracks[i].Finished;
						}
					}
				}
				event = MIDI_META;
				break;

			case 119:	// EMIDI Global Loop End
				if (data2 == 127)
				{
					for (i = 0; i < NumTracks; ++i)
					{
						if (Tracks[i].LoopCount >= 0)
						{
							if (Tracks[i].LoopCount == 0 && !m_Looping)
							{
								Tracks[i].Finished = true;
							}
							else
							{
								if (Tracks[i].LoopCount > 0 && --Tracks[i].LoopCount == 0)
								{
									Tracks[i].LoopCount = -1;
								}
								Tracks[i].TrackP = Tracks[i].LoopBegin;
								Tracks[i].Delay = Tracks[i].LoopDelay;
								Tracks[i].Finished = Tracks[i].LoopFinished;
							}
						}
					}
				}
				event = MIDI_META;
				break;
			}
		}
		if (event != MIDI_META && (!track->Designated || (track->Designation & DesignationMask)))
		{
			events[2] = event | (data1<<8) | (data2<<16);
		}
	}
	else
	{
		// SysEx events could potentially not have enough room in the buffer...
		if (event == MIDI_SYSEX || event == MIDI_SYSEXEND)
		{
			len = track->ReadVarLen();
			if (len >= (MAX_EVENTS-1)*3*4)
			{ // This message will never fit. Throw it away.
				track->TrackP += len;
			}
			else if (len + 12 >= (size_t)room * 4)
			{ // Not enough room left in this buffer. Backup and wait for the next one.
				track->TrackP = start_p;
				sysex_noroom = true;
				return events;
			}
			else
			{
				BYTE *msg = (BYTE *)&events[3];
				if (event == MIDI_SYSEX)
				{ // Need to add the SysEx marker to the message.
					events[2] = (MEVT_LONGMSG << 24) | (len + 1);
					*msg++ = MIDI_SYSEX;
				}
				else
				{
					events[2] = (MEVT_LONGMSG << 24) | len;
				}
				memcpy(msg, &track->TrackBegin[track->TrackP], len);
				msg += len;
				// Must pad with 0
				while ((size_t)msg & 3)
				{
					*msg++ = 0;
				}
				track->TrackP += len;
			}
		}
		else if (event == MIDI_META)
		{
			// It's a meta-event
			event = track->TrackBegin[track->TrackP++];
			CHECK_FINISHED
			len = track->ReadVarLen ();
			CHECK_FINISHED

			if (track->TrackP + len <= track->MaxTrackP)
			{
				switch (event)
				{
				case MIDI_META_EOT:
					track->Finished = true;
					break;

				case MIDI_META_TEMPO:
					Tempo =
						(track->TrackBegin[track->TrackP+0]<<16) |
						(track->TrackBegin[track->TrackP+1]<<8)  |
						(track->TrackBegin[track->TrackP+2]);
					events[0] = delay;
					events[1] = 0;
					events[2] = (MEVT_TEMPO << 24) | Tempo;
					break;
				}
				track->TrackP += len;
				if (track->TrackP == track->MaxTrackP)
				{
					track->Finished = true;
				}
			}
			else
			{
				track->Finished = true;
			}
		}
	}